

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_whitelist_sign
              (secp256k1_context *ctx,secp256k1_whitelist_signature *sig,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,size_t n_keys,
              secp256k1_pubkey *sub_pubkey,uchar *online_seckey,uchar *summed_seckey,size_t index)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  size_t sVar5;
  uchar uVar6;
  uchar uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  uint counter;
  uchar *nonce32_00;
  secp256k1_scalar *r;
  bool bVar13;
  int overflow_1;
  undefined4 local_a07c;
  secp256k1_scalar sec;
  secp256k1_scalar non;
  uchar msg32 [32];
  size_t n_keys_local;
  uchar nonce32 [32];
  int overflow;
  secp256k1_scalar s [255];
  secp256k1_gej pubs [255];
  
  sVar5 = index;
  n_keys_local = n_keys;
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_whitelist_sign_cold_9();
  }
  else if (sig == (secp256k1_whitelist_signature *)0x0) {
    secp256k1_whitelist_sign_cold_8();
  }
  else if (online_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_whitelist_sign_cold_7();
  }
  else if (offline_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_whitelist_sign_cold_6();
  }
  else if (n_keys < 0x100) {
    if (sub_pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_whitelist_sign_cold_4();
    }
    else if (online_seckey == (uchar *)0x0) {
      secp256k1_whitelist_sign_cold_3();
    }
    else if (summed_seckey == (uchar *)0x0) {
      secp256k1_whitelist_sign_cold_2();
    }
    else {
      if (index < n_keys) {
        iVar9 = secp256k1_whitelist_compute_keys_and_message
                          (ctx,msg32,pubs,online_pubkeys,offline_pubkeys,(int)n_keys,sub_pubkey);
        if (iVar9 == 0) {
          uVar11 = (undefined4)CONCAT71((int7)((ulong)online_pubkeys >> 8),1);
        }
        else {
          overflow = 0;
          secp256k1_scalar_set_b32(&sec,summed_seckey,&overflow);
          uVar12 = CONCAT71((int7)((ulong)online_pubkeys >> 8),1);
          uVar11 = (undefined4)uVar12;
          if ((overflow == 0) &&
             (((sec.d[1] != 0 || sec.d[0] != 0) || sec.d[2] != 0) || sec.d[3] != 0)) {
            secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)s,&sec);
            iVar9 = secp256k1_whitelist_hash_pubkey(&non,(secp256k1_gej *)s);
            uVar11 = (undefined4)CONCAT71((int7)((ulong)uVar12 >> 8),1);
            if (iVar9 != 0) {
              secp256k1_scalar_mul(&sec,&sec,&non);
              secp256k1_scalar_set_b32(s,online_seckey,&overflow);
              if ((overflow == 0) &&
                 (((s[0].d[1] != 0 || s[0].d[0] != 0) || s[0].d[2] != 0) || s[0].d[3] != 0)) {
                uVar11 = 0;
              }
              else {
                uVar11 = (undefined4)CONCAT71((int7)((ulong)online_seckey >> 8),1);
              }
              secp256k1_scalar_add(&sec,&sec,s);
              non.d[0] = 0;
              non.d[1] = 0;
              non.d[2] = 0;
              non.d[3] = 0;
            }
          }
          if ((char)uVar11 != '\0') {
            sec.d[2] = 0;
            sec.d[3] = 0;
            sec.d[0] = 0;
            sec.d[1] = 0;
          }
        }
        if ((char)uVar11 == '\0') {
          overflow_1 = 0;
          local_a07c = uVar11;
          secp256k1_scalar_get_b32((uchar *)&overflow,&sec);
          uVar7 = msg32[1];
          uVar6 = msg32[0];
          counter = 0;
          do {
            nonce_function_rfc6979
                      (nonce32,msg32,(uchar *)&overflow,(uchar *)0x0,(void *)0x0,counter);
            secp256k1_scalar_set_b32(&non,nonce32,&overflow_1);
            nonce32[0x10] = '\0';
            nonce32[0x11] = '\0';
            nonce32[0x12] = '\0';
            nonce32[0x13] = '\0';
            nonce32[0x14] = '\0';
            nonce32[0x15] = '\0';
            nonce32[0x16] = '\0';
            nonce32[0x17] = '\0';
            nonce32[0x18] = '\0';
            nonce32[0x19] = '\0';
            nonce32[0x1a] = '\0';
            nonce32[0x1b] = '\0';
            nonce32[0x1c] = '\0';
            nonce32[0x1d] = '\0';
            nonce32[0x1e] = '\0';
            nonce32[0x1f] = '\0';
            nonce32[0] = '\0';
            nonce32[1] = '\0';
            nonce32[2] = '\0';
            nonce32[3] = '\0';
            nonce32[4] = '\0';
            nonce32[5] = '\0';
            nonce32[6] = '\0';
            nonce32[7] = '\0';
            nonce32[8] = '\0';
            nonce32[9] = '\0';
            nonce32[10] = '\0';
            nonce32[0xb] = '\0';
            nonce32[0xc] = '\0';
            nonce32[0xd] = '\0';
            nonce32[0xe] = '\0';
            nonce32[0xf] = '\0';
            if ((overflow_1 == 0) &&
               (((non.d[1] != 0 || non.d[0] != 0) || non.d[2] != 0) || non.d[3] != 0)) {
              r = s;
              lVar8 = 1;
              nonce32_00 = sig->data;
              do {
                lVar10 = lVar8;
                nonce32_00 = nonce32_00 + 0x20;
                if (lVar10 - n_keys == 1) {
                  bVar13 = true;
                  goto LAB_00133fc3;
                }
                msg32[0] = uVar6 ^ (byte)lVar10;
                msg32[1] = (byte)((ulong)lVar10 >> 8) ^ uVar7;
                nonce_function_rfc6979
                          (nonce32_00,msg32,(uchar *)&overflow,(uchar *)0x0,(void *)0x0,counter);
                secp256k1_scalar_set_b32(r,nonce32_00,&overflow_1);
                if (overflow_1 != 0) break;
                puVar1 = r->d;
                puVar2 = r->d;
                puVar3 = r->d;
                puVar4 = r->d;
                r = r + 1;
                lVar8 = lVar10 + 1;
              } while (((puVar1[1] != 0 || *puVar2 != 0) || puVar3[2] != 0) || puVar4[3] != 0);
              bVar13 = n_keys <= lVar10 - 1U;
              counter = counter + 1;
            }
            else {
              counter = counter + 1;
              bVar13 = false;
            }
LAB_00133fc3:
          } while (!bVar13);
          if ((char)local_a07c == '\0') {
            sig->n_keys = n_keys;
            iVar9 = secp256k1_borromean_sign
                              (&ctx->ecmult_gen_ctx,sig->data,s,pubs,&non,&sec,&n_keys_local,&index,
                               1,msg32,0x20);
            secp256k1_scalar_get_b32(sig->data + sVar5 * 0x20 + 0x20,s + sVar5);
            return iVar9;
          }
        }
        return 0;
      }
      secp256k1_whitelist_sign_cold_1();
    }
  }
  else {
    secp256k1_whitelist_sign_cold_5();
  }
  return 0;
}

Assistant:

int secp256k1_whitelist_sign(const secp256k1_context* ctx, secp256k1_whitelist_signature *sig, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const size_t n_keys, const secp256k1_pubkey *sub_pubkey, const unsigned char *online_seckey, const unsigned char *summed_seckey, const size_t index) {
    secp256k1_gej pubs[MAX_KEYS];
    secp256k1_scalar s[MAX_KEYS];
    secp256k1_scalar sec, non;
    unsigned char msg32[32];
    int ret;

    /* Sanity checks */
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig != NULL);
    ARG_CHECK(online_pubkeys != NULL);
    ARG_CHECK(offline_pubkeys != NULL);
    ARG_CHECK(n_keys <= MAX_KEYS);
    ARG_CHECK(sub_pubkey != NULL);
    ARG_CHECK(online_seckey != NULL);
    ARG_CHECK(summed_seckey != NULL);
    ARG_CHECK(index < n_keys);

    /* Compute pubkeys: online_pubkey + tweaked(offline_pubkey + address), and message */
    ret = secp256k1_whitelist_compute_keys_and_message(ctx, msg32, pubs, online_pubkeys, offline_pubkeys, n_keys, sub_pubkey);

    /* Compute signing key: online_seckey + tweaked(summed_seckey) */
    if (ret) {
        ret = secp256k1_whitelist_compute_tweaked_privkey(ctx, &sec, online_seckey, summed_seckey);
    }
    /* Compute nonce and random s-values */
    if (ret) {
        unsigned char seckey32[32];
        unsigned int count = 0;
        int overflow = 0;

        secp256k1_scalar_get_b32(seckey32, &sec);
        while (1) {
            size_t i;
            unsigned char nonce32[32];
            int done;
            ret = secp256k1_nonce_function_default(nonce32, msg32, seckey32, NULL, NULL, count);
            if (!ret) {
                break;
            }
            secp256k1_scalar_set_b32(&non, nonce32, &overflow);
            memset(nonce32, 0, 32);
            if (overflow || secp256k1_scalar_is_zero(&non)) {
                count++;
                continue;
            }
            done = 1;
            for (i = 0; i < n_keys; i++) {
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                ret = secp256k1_nonce_function_default(&sig->data[32 * (i + 1)], msg32, seckey32, NULL, NULL, count);
                if (!ret) {
                    break;
                }
                secp256k1_scalar_set_b32(&s[i], &sig->data[32 * (i + 1)], &overflow);
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                if (overflow || secp256k1_scalar_is_zero(&s[i])) {
                    count++;
                    done = 0;
                    break;
                }
            }
            if (done) {
                break;
            }
        }
        memset(seckey32, 0, 32);
    }
    /* Actually sign */
    if (ret) {
        sig->n_keys = n_keys;
        ret = secp256k1_borromean_sign(&ctx->ecmult_gen_ctx, &sig->data[0], s, pubs, &non, &sec, &n_keys, &index, 1, msg32, 32);
        /* Signing will change s[index], so update in the sig structure */
        secp256k1_scalar_get_b32(&sig->data[32 * (index + 1)], &s[index]);
    }

    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    return ret;
}